

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

int Acb_ObjPushToFanins(Acb_Ntk_t *p,int iObj,int nLutSize)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iFanout;
  int *pFanins;
  int iFanin;
  int k2;
  int k;
  int nLutSize_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjFaninNum(p,iObj);
  if (1 < iVar1) {
    iFanin = 0;
    piVar3 = Acb_ObjFanins(p,iObj);
    for (; iFanin < *piVar3; iFanin = iFanin + 1) {
      iVar1 = piVar3[iFanin + 1];
      iVar2 = Acb_ObjIsCi(p,iVar1);
      if ((((iVar2 == 0) && (iVar2 = Acb_ObjFanoutNum(p,iVar1), iVar2 < 2)) &&
          (iVar2 = Acb_ObjFaninNum(p,iVar1), iVar2 != nLutSize)) &&
         (iVar2 = Acb_ObjFindFaninPushableIndex(p,iObj,iFanin), iVar2 != -1)) {
        Acb_ObjPushToFanin(p,iObj,iVar2,iVar1);
        return 1;
      }
    }
    iVar1 = Acb_ObjFaninNum(p,iObj);
    if ((iVar1 == 2) && (iVar1 = Acb_ObjFanoutNum(p,iObj), iVar1 == 1)) {
      iVar1 = Acb_ObjFanout(p,iObj,0);
      iVar2 = Acb_ObjIsCo(p,iVar1);
      if ((iVar2 == 0) && (iVar2 = Acb_ObjFaninNum(p,iVar1), iVar2 < nLutSize)) {
        iVar2 = Acb_ObjFindFanoutPushableIndex(p,iObj);
        Acb_ObjPushToFanout(p,iObj,iVar2,iVar1);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int Acb_ObjPushToFanins( Acb_Ntk_t * p, int iObj, int nLutSize )
{
    int k, k2, iFanin, * pFanins;
    if ( Acb_ObjFaninNum(p, iObj) < 2 )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Acb_ObjIsCi(p, iFanin) )
            continue;
        if ( Acb_ObjFanoutNum(p, iFanin) > 1 )
            continue;
        if ( Acb_ObjFaninNum(p, iFanin) == nLutSize )
            continue;
        if ( (k2 = Acb_ObjFindFaninPushableIndex(p, iObj, k)) == -1 )
            continue;
        //printf( "Object %4d : Pushing fanin %d (%d) into fanin %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanin );
        Acb_ObjPushToFanin( p, iObj, k2, iFanin );
        return 1;
    }
    if ( Acb_ObjFaninNum(p, iObj) == 2 && Acb_ObjFanoutNum(p, iObj) == 1 )
    {
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        if ( !Acb_ObjIsCo(p, iFanout) && Acb_ObjFaninNum(p, iFanout) < nLutSize )
        {
            k2 = Acb_ObjFindFanoutPushableIndex( p, iObj );
            //printf( "Object %4d : Pushing fanin %d (%d) into fanout %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanout );
            Acb_ObjPushToFanout( p, iObj, k2, iFanout );
            return 1;
        }
    }
    return 0;
}